

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_new_session_ticket
              (uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *ticket,
              uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  ushort *puVar1;
  ushort uVar2;
  uint uVar3;
  ushort *puVar4;
  int iVar5;
  ushort *puVar6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  int iVar11;
  ushort *puVar12;
  ushort *puVar13;
  bool bVar14;
  
  iVar11 = 0x32;
  if (3 < (long)end - (long)src) {
    uVar3 = *(uint *)src;
    *lifetime = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    iVar11 = 0x32;
    if (3 < (long)end - (long)(src + 4)) {
      uVar3 = *(uint *)(src + 4);
      *age_add = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      puVar12 = (ushort *)(src + 8);
      iVar11 = 0x32;
      if ((ulong)((long)end - (long)puVar12) < 2) {
        bVar14 = false;
        puVar6 = puVar12;
      }
      else {
        lVar9 = 0;
        uVar8 = 0;
        do {
          uVar8 = (ulong)*(byte *)((long)puVar12 + lVar9) | uVar8 << 8;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 2);
        puVar13 = (ushort *)(src + 10);
        bVar14 = false;
        puVar6 = puVar13;
        if (uVar8 - 1 < (ulong)((long)end - (long)puVar13)) {
          puVar6 = (ushort *)((long)puVar12 + uVar8 + 2);
          ticket->base = (uint8_t *)puVar13;
          ticket->len = (long)puVar6 - (long)puVar13;
          bVar14 = true;
          iVar11 = 0;
        }
      }
      if (bVar14) {
        *max_early_data_size = 0;
        if ((ulong)((long)end - (long)puVar6) < 2) {
          puVar12 = puVar6;
          iVar11 = 0x32;
          bVar14 = false;
        }
        else {
          lVar9 = 0;
          uVar8 = 0;
          do {
            uVar8 = (ulong)*(byte *)((long)puVar6 + lVar9) | uVar8 << 8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 2);
          puVar12 = puVar6 + 1;
          iVar5 = 0x32;
          if ((ulong)((long)end - (long)puVar12) < uVar8) {
LAB_0010ea5e:
            iVar11 = iVar5;
            bVar14 = false;
          }
          else {
            bVar14 = true;
            if (uVar8 != 0) {
              puVar6 = (ushort *)((long)puVar6 + uVar8 + 2);
              bVar10 = 0;
              puVar13 = puVar12;
              do {
                if ((long)puVar6 - (long)puVar13 < 2) {
                  puVar12 = puVar13;
                  iVar5 = 0x32;
                  goto LAB_0010ea5e;
                }
                uVar2 = *puVar13;
                uVar7 = uVar2 << 8 | uVar2 >> 8;
                puVar12 = puVar13 + 1;
                if (uVar7 < 8) {
                  if ((bVar10 >> (uVar7 & 0x1f) & 1) != 0) {
                    iVar5 = 0x2f;
                    goto LAB_0010ea5e;
                  }
                  bVar10 = (byte)(1 << ((byte)(uVar2 >> 8) & 0x1f)) & 7 | bVar10;
                }
                iVar11 = 0x32;
                if ((ulong)((long)puVar6 - (long)puVar12) < 2) {
                  bVar14 = false;
                }
                else {
                  lVar9 = 0;
                  uVar8 = 0;
                  do {
                    uVar8 = (ulong)*(byte *)((long)puVar12 + lVar9) | uVar8 << 8;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 2);
                  puVar12 = puVar13 + 2;
                  if ((ulong)((long)puVar6 - (long)puVar12) < uVar8) {
LAB_0010eb22:
                    iVar11 = 0x32;
                    bVar14 = false;
                  }
                  else {
                    puVar1 = (ushort *)((long)puVar12 + uVar8);
                    puVar4 = puVar1;
                    if (uVar7 == 0x2e) {
                      if ((long)uVar8 < 4) goto LAB_0010eb22;
                      uVar3 = *(uint *)(puVar13 + 2);
                      *max_early_data_size =
                           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18;
                      puVar4 = puVar13 + 4;
                    }
                    puVar12 = puVar4;
                    bVar14 = puVar12 == puVar1;
                    iVar11 = 0x32;
                    if (bVar14) {
                      iVar11 = 0;
                    }
                  }
                }
                iVar5 = iVar11;
                if (!bVar14) goto LAB_0010ea5e;
                puVar13 = puVar12;
                bVar14 = true;
              } while (puVar12 != puVar6);
            }
          }
        }
        if ((bVar14) && (iVar11 = 0x32, puVar12 == (ushort *)end)) {
          iVar11 = 0;
        }
      }
    }
  }
  return iVar11;
}

Assistant:

static int decode_new_session_ticket(uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *ticket, uint32_t *max_early_data_size,
                                     const uint8_t *src, const uint8_t *end)
{
    uint16_t exttype;
    int ret;

    if ((ret = decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = decode32(age_add, &src, end)) != 0)
        goto Exit;
    decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, &exttype, {
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_TICKET_EARLY_DATA_INFO:
            if ((ret = decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}